

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O0

void __thiscall StringTest::Test3(StringTest *this)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  allocator<char> local_b9;
  string local_b8 [8];
  string t4;
  undefined1 local_90 [8];
  string t3;
  undefined1 local_68 [8];
  string t2;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string t1;
  StringTest *this_local;
  
  t1.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"abc",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"def",(allocator<char> *)(t3.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(t3.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"abc",(allocator<char> *)(t4.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(t4.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"abcdef",&local_b9);
  std::allocator<char>::~allocator(&local_b9);
  iVar3 = std::__cxx11::string::compare((string *)local_30);
  if (-1 < iVar3) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xc1,"t1 compare t2");
  }
  iVar3 = std::__cxx11::string::compare((string *)local_68);
  if (iVar3 < 1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xc4,"t2 compare t1");
  }
  iVar3 = std::__cxx11::string::compare((string *)local_30);
  if (iVar3 != 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,199,"t1 compare t3");
  }
  iVar3 = std::__cxx11::string::compare((string *)local_30);
  if (-1 < iVar3) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xca,"t1 compare t4");
  }
  iVar3 = std::__cxx11::string::compare(local_b8);
  if (iVar3 < 1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xcd,"t4 compare t1");
  }
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_90);
  if (bVar1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xd0,"t1 != t3");
  }
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_68);
  if (_Var2) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xd3,"t1 == t2");
  }
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"abc");
  if (bVar1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xd6,"t1 != abc");
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"def");
  if (bVar1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xd9,"t1 == def");
  }
  bVar1 = std::operator!=("abc",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_30);
  if (bVar1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xdc,"abc != t1");
  }
  bVar1 = std::operator==("def",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_30);
  if (bVar1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xdf,"def == t1");
  }
  TestCase::TestPassed(&this->super_TestCase);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void Test3()
	{
		string t1 = "abc";
		string t2 = "def";
		string t3 = "abc";
		string t4 = "abcdef";
		
		if ( t1.compare( t2 ) >= 0 )
			TestFailed( "t1 compare t2" );
		
		if ( t2.compare( t1 ) <= 0 )
			TestFailed( "t2 compare t1" );

		if ( t1.compare( t3 ) != 0 )
			TestFailed( "t1 compare t3" );

		if ( t1.compare( t4 ) >= 0 )
			TestFailed( "t1 compare t4" );

		if ( t4.compare( t1 ) <= 0 )
			TestFailed( "t4 compare t1" );

		if ( t1 != t3 )
			TestFailed( "t1 != t3" );

		if ( t1 == t2 )
			TestFailed( "t1 == t2" );

		if ( t1 != "abc" )
			TestFailed( "t1 != abc" );

		if ( t1 == "def" )
			TestFailed( "t1 == def" );

		if ( "abc" != t1 )
			TestFailed( "abc != t1" );

		if ( "def" == t1 )
			TestFailed( "def == t1" );
		
		TestPassed();
	}